

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O1

void lsim::gui::CircuitEditorFactory::rematerialize_component
               (CircuitEditor *circuit,ComponentWidget *ui_component)

{
  if (circuit == (CircuitEditor *)0x0) {
    __assert_fail("circuit",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/circuit_editor.cpp"
                  ,0x3bc,
                  "static void lsim::gui::CircuitEditorFactory::rematerialize_component(CircuitEditor *, ComponentWidget *)"
                 );
  }
  if (ui_component != (ComponentWidget *)0x0) {
    ComponentWidget::dematerialize(ui_component);
    materialize_component(ui_component);
    return;
  }
  __assert_fail("ui_component",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/circuit_editor.cpp"
                ,0x3bd,
                "static void lsim::gui::CircuitEditorFactory::rematerialize_component(CircuitEditor *, ComponentWidget *)"
               );
}

Assistant:

void CircuitEditorFactory::rematerialize_component(CircuitEditor *circuit, ComponentWidget *ui_component) {
	assert(circuit);
	assert(ui_component);

	ui_component->dematerialize();
	materialize_component(ui_component);
}